

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

char * __thiscall FStringTable::operator[](FStringTable *this,char *name)

{
  uint uVar1;
  int iVar2;
  StringEntry *pSStack_30;
  int cmpval;
  StringEntry *entry;
  DWORD bucket;
  char *name_local;
  FStringTable *this_local;
  
  if (name != (char *)0x0) {
    uVar1 = MakeKey(name);
    for (pSStack_30 = this->Buckets[uVar1 & 0x7f]; pSStack_30 != (StringEntry *)0x0;
        pSStack_30 = pSStack_30->Next) {
      iVar2 = strcasecmp(pSStack_30->Name,name);
      if (iVar2 == 0) {
        return &pSStack_30->field_0x11;
      }
      if (iVar2 == 1) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *FStringTable::operator[] (const char *name) const
{
	if (name == NULL)
	{
		return NULL;
	}
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry *entry = Buckets[bucket];

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			return entry->String;
		}
		if (cmpval == 1)
		{
			return NULL;
		}
		entry = entry->Next;
	}
	return NULL;
}